

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

void __thiscall
mapbox::detail::Earcut<unsigned_int>::splitEarcut(Earcut<unsigned_int> *this,Node *start)

{
  bool bVar1;
  Node *pNVar2;
  Node *ear;
  Node *c;
  Node *b;
  Node *a;
  Node *start_local;
  Earcut<unsigned_int> *this_local;
  
  b = start;
  do {
    for (c = b->next->next; c != b->prev; c = c->next) {
      if ((b->i != c->i) && (bVar1 = isValidDiagonal(this,b,c), bVar1)) {
        pNVar2 = splitPolygon(this,b,c);
        ear = filterPoints(this,b,b->next);
        pNVar2 = filterPoints(this,pNVar2,pNVar2->next);
        earcutLinked(this,ear,0);
        earcutLinked(this,pNVar2,0);
        return;
      }
    }
    b = b->next;
    if (b == start) {
      return;
    }
  } while( true );
}

Assistant:

void Earcut<N>::splitEarcut(Node* start) {
    // look for a valid diagonal that divides the polygon into two
    Node* a = start;
    do {
        Node* b = a->next->next;
        while (b != a->prev) {
            if (a->i != b->i && isValidDiagonal(a, b)) {
                // split the polygon in two by the diagonal
                Node* c = splitPolygon(a, b);

                // filter colinear points around the cuts
                a = filterPoints(a, a->next);
                c = filterPoints(c, c->next);

                // run earcut on each half
                earcutLinked(a);
                earcutLinked(c);
                return;
            }
            b = b->next;
        }
        a = a->next;
    } while (a != start);
}